

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

void __thiscall
nuraft::nuraft_global_mgr::commit_worker_loop(nuraft_global_mgr *this,ptr<worker_handle> *handle)

{
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *this_00;
  _List_node_base *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  pthread_t __target_thread;
  undefined4 extraout_var;
  lock_guard<std::mutex> l;
  pthread_mutex_t *__mutex;
  bool bVar6;
  ptr<raft_server> target;
  string local_90;
  size_t local_70;
  pthread_mutex_t *local_68;
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> local_60;
  string thread_name;
  
  std::__cxx11::to_string
            (&local_90,
             ((handle->
              super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->id_);
  std::operator+(&thread_name,"nuraft_g_c",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,thread_name._M_dataplus._M_p);
  __mutex = (pthread_mutex_t *)&this->commit_queue_lock_;
  this_00 = &this->commit_queue_;
  bVar6 = false;
  while (((((handle->
            super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->stopping_)._M_base._M_i & 1U) == 0) {
    if (!bVar6) {
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = SLEEPING;
      UNLOCK();
      EventAwaiter::wait_us
                (&((handle->
                   super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->ea_,1000000);
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->ea_).status._M_i = idle;
      UNLOCK();
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = WORKING;
      UNLOCK();
    }
    if (((((handle->
           super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->stopping_)._M_base._M_i & 1U) != 0) break;
    target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::mutex::lock((mutex *)&__mutex->__data);
    p_Var1 = (this_00->
             super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      bVar6 = false;
      local_70 = 0;
    }
    else {
      std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1));
      std::
      _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&(this->commit_server_set_)._M_h,&target);
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::pop_front(this_00);
      local_70 = (this->commit_queue_).
                 super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 ._M_impl._M_node._M_size;
      bVar6 = (this->commit_queue_).
              super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00;
    }
    pthread_mutex_unlock(__mutex);
    peVar3 = target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar2 = ((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar5 = (*peVar2->_vptr_logger[7])();
        if (5 < iVar5) {
          peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_(&local_90,"execute commit for %p");
          (*peVar2->_vptr_logger[8])
                    (peVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                     ,"commit_worker_loop",0x13a,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
      if ((((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           sm_commit_paused_)._M_base._M_i & 1U) == 0) {
        bVar6 = true;
        if (((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
            ((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            quick_commit_index_).super___atomic_base<unsigned_long>._M_i) {
          iVar5 = (*(((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->log_store_).
                     super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_log_store[2])();
          if (((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
              CONCAT44(extraout_var,iVar5) - 1U) {
            peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar2 != (element_type *)0x0) {
              iVar5 = (*peVar2->_vptr_logger[7])();
              if (5 < iVar5) {
                peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_68 = __mutex;
                msg_if_given_abi_cxx11_
                          (&local_90,"execute commit by global worker, queue length %zu",local_70);
                (*peVar2->_vptr_logger[8])
                          (peVar2,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                           ,"commit_worker_loop",0x14a,&local_90);
                std::__cxx11::string::~string((string *)&local_90);
                __mutex = local_68;
              }
            }
            bVar4 = raft_server::commit_in_bg_exec
                              (target.
                               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(this->config_).max_scheduling_unit_ms_);
            peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (bVar4) {
              if (peVar2 != (element_type *)0x0) {
                iVar5 = (*peVar2->_vptr_logger[7])();
                if (5 < iVar5) {
                  peVar2 = (peVar3->l_).
                           super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  msg_if_given_abi_cxx11_(&local_90,"executed in time");
                  (*peVar2->_vptr_logger[8])
                            (peVar2,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                             ,"commit_worker_loop",0x154,&local_90);
                  goto LAB_001eb141;
                }
              }
            }
            else {
              if (peVar2 != (element_type *)0x0) {
                iVar5 = (*peVar2->_vptr_logger[7])();
                if (5 < iVar5) {
                  peVar2 = (peVar3->l_).
                           super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  msg_if_given_abi_cxx11_
                            (&local_90,"couldn\'t finish in time (%zu ms), re-push to queue",
                             (this->config_).max_scheduling_unit_ms_);
                  (*peVar2->_vptr_logger[8])
                            (peVar2,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                             ,"commit_worker_loop",0x151,&local_90);
                  std::__cxx11::string::~string((string *)&local_90);
                }
              }
              std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_60,
                         &target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                        );
              request_commit(this,(ptr<raft_server> *)&local_60);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_60._M_refcount);
            }
          }
        }
      }
      else {
        peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        bVar6 = true;
        if (peVar2 != (element_type *)0x0) {
          iVar5 = (*peVar2->_vptr_logger[7])();
          if (5 < iVar5) {
            peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_(&local_90,"commit of this server has been paused");
            (*peVar2->_vptr_logger[8])
                      (peVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                       ,"commit_worker_loop",0x13d,&local_90);
LAB_001eb141:
            bVar6 = true;
            std::__cxx11::string::~string((string *)&local_90);
          }
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::string::~string((string *)&thread_name);
  return;
}

Assistant:

void nuraft_global_mgr::commit_worker_loop(ptr<worker_handle> handle) {
    std::string thread_name = "nuraft_g_c" + std::to_string(handle->id_);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    bool skip_sleeping = false;
    while (!handle->stopping_) {
        if (!skip_sleeping) {
            handle->status_ = worker_handle::SLEEPING;
            // Wake up for every 1 second even without invoke, just in case.
            handle->ea_.wait_ms(1000);
            handle->ea_.reset();
            handle->status_ = worker_handle::WORKING;
        }
        if (handle->stopping_) break;

        skip_sleeping = false;
        size_t queue_length = 0;
        ptr<raft_server> target = nullptr;
        {
            std::lock_guard<std::mutex> l(commit_queue_lock_);
            auto entry = commit_queue_.begin();
            if (entry != commit_queue_.end()) {
                target = *entry;
                commit_server_set_.erase(target);
                commit_queue_.pop_front();
                queue_length = commit_queue_.size();
                if (!commit_queue_.empty()) {
                    // Other requests are waiting in the queue,
                    // skip sleeping next time.
                    skip_sleeping = true;
                }
            }
        }
        if (!target) continue;

        ptr<logger>& l_ = target->l_;

        // Whenever we find a task to execute, skip next sleeping for any tasks
        // that can be queued in the meantime.
        skip_sleeping = true;

        p_tr("execute commit for %p", target.get());

        if (target->sm_commit_paused_) {
            p_tr("commit of this server has been paused");
            // Since there can be other Raft server waiting for being served,
            // need to skip nest sleep.
            continue;
        }

        if ( target->quick_commit_index_ <= target->sm_commit_index_ ||
             target->log_store_->next_slot() - 1 <= target->sm_commit_index_ ) {
            // State machine's commit index is large enough not to execute commit
            // (see the comment in `commit_in_bg()`).
            continue;
        }

        p_tr("execute commit by global worker, queue length %zu", queue_length);
        bool finished_in_time =
            target->commit_in_bg_exec(config_.max_scheduling_unit_ms_);
        if (!finished_in_time) {
            // Commit took too long time and aborted in the middle.
            // Put this server to queue again.
            p_tr("couldn't finish in time (%zu ms), re-push to queue",
                 config_.max_scheduling_unit_ms_);
            request_commit(target);
        } else {
            p_tr("executed in time");
        }
    }
}